

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O0

void xc_hyb_gga_xc_wp04_init(xc_func_type *p)

{
  xc_func_type *in_RDI;
  double funcs_coef [4];
  double PP [5];
  double local_38 [6];
  xc_func_type *local_8;
  
  local_8 = in_RDI;
  memset(local_38,0,0x28);
  local_38[0] = 0.1189;
  local_38[1] = 0.9614;
  local_38[2] = 0.9999;
  local_38[3] = 0.0001;
  local_38[4] = 0.9999;
  xc_mix_init((xc_func_type *)0x3f1a36e2eb1c432d,0x3feffe5c,(int *)0x3feec3c9eecbfb16,
              (double *)0x3fa3b645a1cac080);
  xc_hyb_init_hybrid(local_8,local_38[0]);
  return;
}

Assistant:

void
xc_hyb_gga_xc_wp04_init(xc_func_type *p)
{
  /* From the paper it is not clear if the LSDA is VWN or VWN_RPA.
     Due to the comparison to B3LYP I think the latter is more likely */
  const double PP[5] = {0.1189, 0.9614, 0.9999, 0.0001, 0.9999};
  static int funcs_id[4] = {XC_LDA_X, XC_GGA_X_B88, XC_LDA_C_VWN_RPA, XC_GGA_C_LYP};
  double funcs_coef[4];

  funcs_coef[0] = PP[2] - PP[1];
  funcs_coef[1] = PP[1];
  funcs_coef[2] = PP[4] - PP[3];
  funcs_coef[3] = PP[3];

  xc_mix_init(p, 4, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, PP[0]);
}